

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  size_t n_00;
  size_t block_size;
  size_t olen;
  size_t j;
  size_t n;
  uchar *puStack_38;
  int ret;
  uchar *state;
  mbedtls_cmac_context_t *cmac_ctx;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_cipher_context_t *ctx_local;
  
  n._4_4_ = 0;
  if ((((ctx != (mbedtls_cipher_context_t *)0x0) &&
       (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) && (input != (uchar *)0x0)) &&
     (ctx->cmac_ctx != (mbedtls_cmac_context_t *)0x0)) {
    state = ctx->cmac_ctx->state;
    cmac_ctx = (mbedtls_cmac_context_t *)ilen;
    ilen_local = (size_t)input;
    input_local = (uchar *)ctx;
    n_00 = mbedtls_cipher_info_get_block_size(ctx->cipher_info);
    puStack_38 = *(uchar **)(input_local + 0x48);
    if ((*(long *)(state + 0x20) != 0) &&
       ((mbedtls_cmac_context_t *)(n_00 - *(long *)(state + 0x20)) < cmac_ctx)) {
      memcpy(state + *(long *)(state + 0x20) + 0x10,(void *)ilen_local,
             n_00 - *(long *)(state + 0x20));
      mbedtls_xor_no_simd(puStack_38,state + 0x10,puStack_38,n_00);
      iVar1 = mbedtls_cipher_update
                        ((mbedtls_cipher_context_t *)input_local,puStack_38,n_00,puStack_38,
                         &block_size);
      if (iVar1 != 0) {
        return iVar1;
      }
      ilen_local = (n_00 - *(long *)(state + 0x20)) + ilen_local;
      cmac_ctx = (mbedtls_cmac_context_t *)((long)cmac_ctx - (n_00 - *(long *)(state + 0x20)));
      state[0x20] = '\0';
      state[0x21] = '\0';
      state[0x22] = '\0';
      state[0x23] = '\0';
      state[0x24] = '\0';
      state[0x25] = '\0';
      state[0x26] = '\0';
      state[0x27] = '\0';
      n._4_4_ = 0;
    }
    j = (ulong)(cmac_ctx->state + (n_00 - 1)) / n_00;
    olen = 1;
    while( true ) {
      if (j <= olen) {
        if (cmac_ctx != (mbedtls_cmac_context_t *)0x0) {
          memcpy(state + *(long *)(state + 0x20) + 0x10,(void *)ilen_local,(size_t)cmac_ctx);
          *(uchar **)(state + 0x20) = cmac_ctx->state + *(long *)(state + 0x20);
        }
        return n._4_4_;
      }
      mbedtls_xor_no_simd(puStack_38,(uchar *)ilen_local,puStack_38,n_00);
      iVar1 = mbedtls_cipher_update
                        ((mbedtls_cipher_context_t *)input_local,puStack_38,n_00,puStack_38,
                         &block_size);
      if (iVar1 != 0) break;
      cmac_ctx = (mbedtls_cmac_context_t *)((long)cmac_ctx - n_00);
      ilen_local = n_00 + ilen_local;
      olen = olen + 1;
      n._4_4_ = 0;
    }
    return iVar1;
  }
  return -0x6100;
}

Assistant:

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,
                               const unsigned char *input, size_t ilen)
{
    mbedtls_cmac_context_t *cmac_ctx;
    unsigned char *state;
    int ret = 0;
    size_t n, j, olen, block_size;

    if (ctx == NULL || ctx->cipher_info == NULL || input == NULL ||
        ctx->cmac_ctx == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cmac_ctx = ctx->cmac_ctx;
    block_size = mbedtls_cipher_info_get_block_size(ctx->cipher_info);
    state = ctx->cmac_ctx->state;

    /* Is there data still to process from the last call, that's greater in
     * size than a block? */
    if (cmac_ctx->unprocessed_len > 0 &&
        ilen > block_size - cmac_ctx->unprocessed_len) {
        memcpy(&cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
               input,
               block_size - cmac_ctx->unprocessed_len);

        mbedtls_xor_no_simd(state, cmac_ctx->unprocessed_block, state, block_size);

        if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                         &olen)) != 0) {
            goto exit;
        }

        input += block_size - cmac_ctx->unprocessed_len;
        ilen -= block_size - cmac_ctx->unprocessed_len;
        cmac_ctx->unprocessed_len = 0;
    }

    /* n is the number of blocks including any final partial block */
    n = (ilen + block_size - 1) / block_size;

    /* Iterate across the input data in block sized chunks, excluding any
     * final partial or complete block */
    for (j = 1; j < n; j++) {
        mbedtls_xor_no_simd(state, input, state, block_size);

        if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                         &olen)) != 0) {
            goto exit;
        }

        ilen -= block_size;
        input += block_size;
    }

    /* If there is data left over that wasn't aligned to a block */
    if (ilen > 0) {
        memcpy(&cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
               input,
               ilen);
        cmac_ctx->unprocessed_len += ilen;
    }

exit:
    return ret;
}